

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall node::isIn(node *this,double x,double a,double b)

{
  double tmp;
  double b_local;
  double a_local;
  double x_local;
  node *this_local;
  
  tmp = b;
  b_local = a;
  if (b < a) {
    tmp = a;
    b_local = b;
  }
  if ((x < b_local) || (tmp < x)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool node::isIn(double x, double a, double b){
    if(a > b){
        double tmp = a;
        a = b;
        b = tmp;
    }
    if(a <= x && x <= b){
        return true;
    }return false;
}